

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallExportGenerator::GetTempDir_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  size_type sVar1;
  pointer pcVar2;
  
  sVar1 = (this->TempDir)._M_string_length;
  if (sVar1 == 0) {
    TempDirCalculate_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->TempDir)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::GetTempDir() const
{
  if (this->TempDir.empty()) {
    return this->TempDirCalculate();
  }
  return this->TempDir;
}